

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O1

int __thiscall ncnn::Crop_x86::forward(Crop_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  bool bVar9;
  pointer pMVar10;
  int iVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  Crop_x86 *pCVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  Mat m;
  int _outw;
  int local_11c;
  int local_118;
  int _outh;
  int _woffset;
  int local_10c;
  int _outc;
  int _outd;
  int _hoffset;
  int local_fc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_e0;
  Allocator *local_d8;
  undefined8 uStack_d0;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  size_t local_b8;
  int _coffset;
  size_t local_a8;
  Mat *local_a0;
  Option *local_98;
  int local_90;
  int _doffset;
  Mat m_2;
  
  local_11c = bottom_blob->w;
  local_10c = bottom_blob->h;
  local_90 = bottom_blob->d;
  local_fc = bottom_blob->c;
  iVar15 = bottom_blob->dims;
  local_a8 = bottom_blob->elemsize;
  local_118 = bottom_blob->elempack;
  if (((this->super_Crop).starts_expr._M_string_length == 0) ||
     ((this->super_Crop).ends_expr._M_string_length == 0)) {
    if (iVar15 - 1U < 4) {
      lVar22 = (long)local_11c;
      m.w = local_11c;
      switch(iVar15) {
      case 1:
        m.w = local_118 * local_11c;
        m.dims = 1;
        m.h = 1;
        m.d = 1;
        m.c = 1;
        m.cstep = (size_t)m.w;
        goto LAB_00281690;
      case 2:
        m.h = local_118 * local_10c;
        m.elemsize._0_4_ = 4;
        m.elempack = 1;
        m.dims = 2;
        m.d = 1;
        m.c = 1;
        m.cstep = m.h * lVar22;
        goto LAB_0028170d;
      case 3:
        m.dims = 3;
        m.d = 1;
        lVar22 = local_10c * lVar22;
        break;
      case 4:
        m.dims = 4;
        lVar22 = local_10c * lVar22 * (long)local_90;
        m.d = local_90;
      }
      m.c = local_118 * local_fc;
      m.cstep = lVar22 + 3U & 0x3ffffffffffffffc;
      m.h = local_10c;
LAB_00281690:
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
    }
    else {
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
LAB_0028170d:
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    Crop::resolve_crop_roi
              (&this->super_Crop,&m,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,
               &_outc);
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_00281a12;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blob_shapes,1,(allocator_type *)&m);
  pMVar10 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  switch(bottom_blob->dims) {
  case 1:
    m.cstep = (long)bottom_blob->elempack * (long)bottom_blob->w;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    break;
  case 2:
    m.w = bottom_blob->w;
    lVar22 = (long)bottom_blob->elempack * (long)bottom_blob->h;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)lVar22;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar22 * m.w;
    break;
  case 3:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 3;
    m.d = 1;
    lVar22 = (long)m.h * (long)m.w;
    goto LAB_00281832;
  case 4:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.d = bottom_blob->d;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 4;
    lVar22 = (long)m.h * (long)m.w * (long)m.d;
LAB_00281832:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    m.cstep = lVar22 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != &m) {
    piVar1 = (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (*(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar10->cstep = 0;
    pMVar10->data = (void *)0x0;
    pMVar10->refcount = (int *)0x0;
    *(undefined8 *)((long)&pMVar10->refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar10->elemsize + 4) = 0;
    pMVar10->dims = 0;
    pMVar10->w = 0;
    pMVar10->h = 0;
    pMVar10->d = 0;
    pMVar10->c = 0;
    pMVar10->data = m.data;
    pMVar10->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar10->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
    pMVar10->elempack = m.elempack;
    pMVar10->allocator = m.allocator;
    pMVar10->dims = m.dims;
    pMVar10->w = m.w;
    pMVar10->h = m.h;
    pMVar10->d = m.d;
    pMVar10->c = m.c;
    pMVar10->cstep = m.cstep;
  }
  piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  Crop::eval_crop_expr
            (&this->super_Crop,&bottom_blob_shapes,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,
             &_outh,&_outd,&_outc);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
LAB_00281a12:
  if (local_118 == 4) {
    pCVar17 = this;
    if (iVar15 == 1) {
      uVar18 = _outw & 3;
      iVar20 = (uint)(uVar18 == 0) * 3 + 1;
      if (_outw / iVar20 == local_11c && uVar18 == 0) {
        if (top_blob != bottom_blob) {
          piVar1 = bottom_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar2 = top_blob->data;
              pAVar3 = top_blob->allocator;
              if (pAVar3 == (Allocator *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (*pAVar3->_vptr_Allocator[3])(pAVar3,pvVar2,(long)_outw % (long)iVar20 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar1 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar1;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar20 = bottom_blob->w;
          iVar19 = bottom_blob->h;
          iVar11 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar20;
          top_blob->h = iVar19;
          top_blob->d = iVar11;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_00281b88:
        bVar23 = false;
        pCVar17 = (Crop_x86 *)0x0;
      }
      else if (((_outw | _woffset) & 3U) == 0) {
        Mat::create(top_blob,_outw / iVar20,(local_a8 >> 2) << (uVar18 == 0) * '\x02',iVar20,
                    opt->blob_allocator);
        pCVar17 = (Crop_x86 *)0xffffff9c;
        if (top_blob->data == (void *)0x0) {
          bVar23 = false;
        }
        else {
          bVar23 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar20 = _woffset + 3;
            if (-1 < _woffset) {
              iVar20 = _woffset;
            }
            crop_pack4_sse(bottom_blob,top_blob,0,iVar20 >> 2);
            goto LAB_00281b88;
          }
        }
      }
      else {
        bVar23 = true;
      }
      if (!bVar23) {
        return (int)pCVar17;
      }
    }
    iVar20 = (int)pCVar17;
    if (iVar15 == 2) {
      bVar23 = (_outh & 3U) == 0;
      iVar19 = (uint)bVar23 * 3 + 1;
      if (_outw == local_11c) {
        if (((_outh & 3U) != 0) || (_outh / iVar19 != local_10c)) goto LAB_00281c24;
        if (top_blob != bottom_blob) {
          piVar1 = bottom_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar2 = top_blob->data;
              pAVar3 = top_blob->allocator;
              if (pAVar3 == (Allocator *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (*pAVar3->_vptr_Allocator[3])(pAVar3,pvVar2,(long)_outh % (long)iVar19 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar1 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar1;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar20 = bottom_blob->w;
          iVar19 = bottom_blob->h;
          iVar11 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar20;
          top_blob->h = iVar19;
          top_blob->d = iVar11;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_00281d0d:
        bVar8 = false;
        iVar20 = 0;
      }
      else {
LAB_00281c24:
        bVar8 = true;
        if (((_hoffset | _outh) & 3U) == 0) {
          Mat::create(top_blob,_outw,_outh / iVar19,(local_a8 >> 2) << bVar23 * '\x02',iVar19,
                      opt->blob_allocator);
          iVar20 = -100;
          if (top_blob->data == (void *)0x0) {
            bVar8 = false;
          }
          else {
            bVar8 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar20 = _hoffset + 3;
              if (-1 < _hoffset) {
                iVar20 = _hoffset;
              }
              crop_pack4_sse(bottom_blob,top_blob,iVar20 >> 2,_woffset);
              goto LAB_00281d0d;
            }
          }
        }
      }
      if (!bVar8) {
        return iVar20;
      }
    }
    local_a0 = top_blob;
    if (iVar15 == 3) {
      bVar24 = (_outc & 3U) == 0;
      iVar19 = (uint)bVar24 * 3 + 1;
      uVar21 = local_a8 >> 2;
      bVar23 = _outh == local_10c;
      bVar8 = _outw == local_11c;
      if (bVar23 && bVar8) {
        if (((_outc & 3U) != 0) || (_outc / iVar19 != local_fc)) goto LAB_00281dc6;
        if (top_blob != bottom_blob) {
          piVar1 = bottom_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar2 = top_blob->data;
              pAVar3 = top_blob->allocator;
              if (pAVar3 == (Allocator *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (*pAVar3->_vptr_Allocator[3])(pAVar3,pvVar2,(long)_outc % (long)iVar19 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar1 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar1;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar20 = bottom_blob->w;
          iVar19 = bottom_blob->h;
          iVar11 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar20;
          top_blob->h = iVar19;
          top_blob->d = iVar11;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar9 = false;
        iVar20 = 0;
      }
      else {
LAB_00281dc6:
        bVar9 = true;
        if (((_coffset | _outc) & 3U) == 0) {
          m.c = _outc / iVar19;
          m.w = bottom_blob->w;
          m.h = bottom_blob->h;
          local_98 = (Option *)CONCAT71(local_98._1_7_,bVar23 && bVar8);
          uVar14 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset / iVar19) * bottom_blob->cstep * uVar14 +
                           (long)bottom_blob->data);
          m.d = bottom_blob->d;
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar14;
          m.elemsize._4_4_ = (undefined4)(uVar14 >> 0x20);
          uVar12 = (long)m.d * uVar14 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0;
          m.cstep = uVar12 / uVar14;
          m.dims = bottom_blob->dims;
          if (bVar23 && bVar8) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,(int)uVar12,
                       (void *)(long)m.w);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar1 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + 1;
                UNLOCK();
              }
              piVar1 = top_blob->refcount;
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (*piVar1 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_4_);
              top_blob->elempack = iStack_e0;
              top_blob->allocator = local_d8;
              top_blob->dims = (int)uStack_d0;
              top_blob->w = uStack_d0._4_4_;
              top_blob->h = local_c8;
              top_blob->d = iStack_c4;
              top_blob->c = iStack_c0;
              top_blob->cstep = local_b8;
            }
            piVar1 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (local_d8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*local_d8->_vptr_Allocator[3])();
                }
              }
            }
            iVar20 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_0028205c;
          }
          else {
LAB_0028205c:
            Mat::create(top_blob,_outw,_outh,_outc / iVar19,uVar21 << bVar24 * '\x02',iVar19,
                        opt->blob_allocator);
            iVar20 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar20 = 0;
              }
              else {
                lVar22 = 0;
                local_98 = opt;
                do {
                  pAVar3 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(m.cstep * lVar22 *
                                 CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) + (long)m.data);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  local_d8 = m.allocator;
                  m_2.h = local_a0->h;
                  m_2.c = local_a0->d;
                  uVar21 = local_a0->elemsize;
                  m_2.data = (void *)(local_a0->cstep * lVar22 * uVar21 + (long)local_a0->data);
                  m_2.elempack = local_a0->elempack;
                  m_2.allocator = local_a0->allocator;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)uVar21;
                  m_2.elemsize._4_4_ = (undefined4)(uVar21 >> 0x20);
                  m_2.d = 1;
                  sVar13 = (long)m_2.h * (long)local_a0->w;
                  m_2.w = local_a0->w;
                  m_2.dims = local_a0->dims + -1;
                  m_2.cstep = (uVar21 * sVar13 + 0xf & 0xfffffffffffffff0) / uVar21;
                  if (local_a0->dims == 4) {
                    m_2.cstep = sVar13;
                  }
                  crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  piVar1 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar1 != (int *)0x0) {
                    LOCK();
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (*piVar1 == 0) {
                      if (pAVar3 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar3->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_b8 = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  iStack_e0 = 0;
                  uStack_d0._0_4_ = 0;
                  uStack_d0._4_4_ = 0;
                  local_c8 = 0;
                  iStack_c4 = 0;
                  iStack_c0 = 0;
                  lVar22 = lVar22 + 1;
                } while (lVar22 < local_a0->c);
                iVar20 = 0;
                top_blob = local_a0;
                opt = local_98;
              }
            }
          }
          piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar9 = false;
        }
      }
      if (!bVar9) {
        return iVar20;
      }
    }
    if (iVar15 == 4) {
      bVar23 = (_outc & 3U) == 0;
      iVar15 = (uint)bVar23 * 3 + 1;
      local_a8 = (local_a8 >> 2) << bVar23 * '\x02';
      bVar23 = local_90 != _outd || (local_10c != _outh || local_11c != _outw);
      if (bVar23) {
LAB_0028244e:
        bVar8 = true;
        if (((_coffset | _outc) & 3U) == 0) {
          m.c = _outc / iVar15;
          m.w = bottom_blob->w;
          m.h = bottom_blob->h;
          uVar21 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset / iVar15) * bottom_blob->cstep * uVar21 +
                           (long)bottom_blob->data);
          m.d = bottom_blob->d;
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar21;
          m.elemsize._4_4_ = (undefined4)(uVar21 >> 0x20);
          uVar14 = (long)m.d * uVar21 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0;
          m.cstep = uVar14 / uVar21;
          m.dims = bottom_blob->dims;
          if (bVar23) {
LAB_002826d0:
            Mat::create(top_blob,_outw,_outh,_outd,_outc / iVar15,local_a8,iVar15,
                        opt->blob_allocator);
            iVar20 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar20 = 0;
              }
              else {
                lVar22 = 0;
                local_98 = opt;
                do {
                  if (0 < _outd) {
                    lVar16 = 0;
                    do {
                      pAVar3 = m.allocator;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)((long)m.data +
                                    (long)(_doffset + (int)lVar16) *
                                    CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) *
                                    (long)m.h * (long)m.w +
                                    m.cstep * lVar22 *
                                    CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize));
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                           (undefined4)m.elemsize;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                      m_2.h = local_a0->h;
                      sVar13 = local_a0->elemsize;
                      m_2.elempack = local_a0->elempack;
                      m_2.allocator = local_a0->allocator;
                      m_2.cstep = (long)m_2.h * (long)local_a0->w;
                      m_2.data = (void *)((long)local_a0->data +
                                         lVar16 * sVar13 * m_2.cstep +
                                         local_a0->cstep * lVar22 * sVar13);
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = (undefined4)sVar13;
                      m_2.elemsize._4_4_ = (undefined4)(sVar13 >> 0x20);
                      m_2.w = local_a0->w;
                      m_2.dims = 2;
                      m_2.d = 1;
                      m_2.c = 1;
                      crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                      piVar1 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                      if (piVar1 != (int *)0x0) {
                        LOCK();
                        *piVar1 = *piVar1 + -1;
                        UNLOCK();
                        if (*piVar1 == 0) {
                          if (m_2.allocator == (Allocator *)0x0) {
                            if (m_2.data != (void *)0x0) {
                              free(m_2.data);
                            }
                          }
                          else {
                            (*(m_2.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_2.cstep = 0;
                      m_2.data = (void *)0x0;
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = 0;
                      m_2.elemsize._4_4_ = 0;
                      m_2.elempack = 0;
                      m_2.dims = 0;
                      m_2.w = 0;
                      m_2.h = 0;
                      m_2.d = 0;
                      m_2.c = 0;
                      piVar1 = (int *)CONCAT44(bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar1 != (int *)0x0) {
                        LOCK();
                        *piVar1 = *piVar1 + -1;
                        UNLOCK();
                        if (*piVar1 == 0) {
                          if (pAVar3 == (Allocator *)0x0) {
                            if (bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar3->_vptr_Allocator[3])();
                          }
                        }
                      }
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      lVar16 = lVar16 + 1;
                    } while (lVar16 < _outd);
                  }
                  lVar22 = lVar22 + 1;
                } while (lVar22 < local_a0->c);
                iVar20 = 0;
                top_blob = local_a0;
                opt = local_98;
              }
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,(int)uVar14,
                       (void *)(long)m.w);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar1 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + 1;
                UNLOCK();
              }
              piVar1 = top_blob->refcount;
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (*piVar1 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_4_);
              top_blob->elempack = iStack_e0;
              top_blob->allocator = local_d8;
              top_blob->dims = (int)uStack_d0;
              top_blob->w = uStack_d0._4_4_;
              top_blob->h = local_c8;
              top_blob->d = iStack_c4;
              top_blob->c = iStack_c0;
              top_blob->cstep = local_b8;
            }
            piVar1 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (local_d8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*local_d8->_vptr_Allocator[3])();
                }
              }
            }
            iVar20 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_002826d0;
          }
          piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          bVar8 = false;
        }
      }
      else {
        if (((_outc & 3U) != 0) || (_outc / iVar15 != local_fc)) goto LAB_0028244e;
        if (top_blob != bottom_blob) {
          piVar1 = bottom_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar2 = top_blob->data;
              pAVar3 = top_blob->allocator;
              if (pAVar3 == (Allocator *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (*pAVar3->_vptr_Allocator[3])(pAVar3,pvVar2,(long)_outc % (long)iVar15 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar1 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar1;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar15 = bottom_blob->w;
          iVar20 = bottom_blob->h;
          iVar19 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar15;
          top_blob->h = iVar20;
          top_blob->d = iVar19;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar8 = false;
        iVar20 = 0;
      }
      if (!bVar8) {
        return iVar20;
      }
    }
  }
  m.data = bottom_blob->data;
  piVar1 = bottom_blob->refcount;
  m.refcount._0_4_ = SUB84(piVar1,0);
  m.refcount._4_4_ = (undefined4)((ulong)piVar1 >> 0x20);
  m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  m.elempack = bottom_blob->elempack;
  m.allocator = bottom_blob->allocator;
  uVar4 = bottom_blob->dims;
  uVar5 = bottom_blob->w;
  uVar6 = bottom_blob->h;
  uVar7 = bottom_blob->d;
  m.c = bottom_blob->c;
  m.cstep = bottom_blob->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  m.dims = uVar4;
  m.w = uVar5;
  m.h = uVar6;
  m.d = uVar7;
  if (local_118 != 1) {
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)opt;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    convert_packing(bottom_blob,&m,1,(Option *)&bottom_blob_shapes);
    if (m.data == (void *)0x0 || (long)m.c * m.cstep == 0) {
      iVar15 = -100;
      goto LAB_00282afb;
    }
  }
  iVar15 = Crop::forward(&this->super_Crop,&m,top_blob,opt);
LAB_00282afb:
  piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar15;
}

Assistant:

int Crop_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(1);
        bottom_blob_shapes[0] = bottom_blob.shape();
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}